

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EntityIdentifier.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LE_EntityIdentifier *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Site:        ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Application: ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Object:      ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString LE_EntityIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << "Site:        " << ( KUINT16 )m_ui8SiteID           << "\n"
       << "Application: " << ( KUINT16 )m_ui8ApplicationID    << "\n"
       << "Object:      " << m_ui16EntityID                   << "\n";

    return ss.str();
}